

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uregex.cpp
# Opt level: O0

int32_t uregex_replaceFirst_63
                  (URegularExpression *regexp2,UChar *replacementText,int32_t replacementLength,
                  UChar *destBuf,int32_t destCapacity,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int local_4c;
  UBool findSucceeded;
  int32_t len;
  RegularExpression *regexp;
  UErrorCode *status_local;
  UChar *pUStack_30;
  int32_t destCapacity_local;
  UChar *destBuf_local;
  UChar *pUStack_20;
  int32_t replacementLength_local;
  UChar *replacementText_local;
  URegularExpression *regexp2_local;
  
  status_local._4_4_ = destCapacity;
  pUStack_30 = destBuf;
  destBuf_local._4_4_ = replacementLength;
  pUStack_20 = replacementText;
  replacementText_local = (UChar *)regexp2;
  UVar1 = validateRE((RegularExpression *)regexp2,'\x01',status);
  if (UVar1 == '\0') {
    regexp2_local._4_4_ = 0;
  }
  else if ((((pUStack_20 == (UChar *)0x0) || (destBuf_local._4_4_ < -1)) ||
           ((pUStack_30 == (UChar *)0x0 && (0 < status_local._4_4_)))) || (status_local._4_4_ < 0))
  {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    regexp2_local._4_4_ = 0;
  }
  else {
    local_4c = 0;
    uregex_reset_63((URegularExpression *)replacementText_local,0,status);
    UVar1 = uregex_find_63((URegularExpression *)replacementText_local,0,status);
    if (UVar1 != '\0') {
      local_4c = uregex_appendReplacement_63
                           ((URegularExpression *)replacementText_local,pUStack_20,
                            destBuf_local._4_4_,&stack0xffffffffffffffd0,
                            (int32_t *)((long)&status_local + 4),status);
    }
    iVar2 = uregex_appendTail_63
                      ((URegularExpression *)replacementText_local,&stack0xffffffffffffffd0,
                       (int32_t *)((long)&status_local + 4),status);
    regexp2_local._4_4_ = iVar2 + local_4c;
  }
  return regexp2_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uregex_replaceFirst(URegularExpression  *regexp2,
                    const UChar         *replacementText,
                    int32_t              replacementLength,
                    UChar               *destBuf,
                    int32_t              destCapacity,
                    UErrorCode          *status)  {
    RegularExpression *regexp = (RegularExpression*)regexp2;
    if (validateRE(regexp, TRUE, status) == FALSE) {
        return 0;
    }
    if (replacementText == NULL || replacementLength < -1 ||
        (destBuf == NULL && destCapacity > 0) ||
        destCapacity < 0) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return 0;
    }

    int32_t   len = 0;
    UBool     findSucceeded;
    uregex_reset(regexp2, 0, status);
    findSucceeded = uregex_find(regexp2, 0, status);
    if (findSucceeded) {
        len = uregex_appendReplacement(regexp2, replacementText, replacementLength,
                                       &destBuf, &destCapacity, status);
    }
    len += uregex_appendTail(regexp2, &destBuf, &destCapacity, status);

    return len;
}